

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

Matrix<float,_3,_2> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,2,3>
          (Matrix<float,_3,_2> *__return_storage_ptr__,MatrixCaseUtils *this,Vector<float,_3> *a,
          Vector<float,_2> *b)

{
  float fVar1;
  int r;
  int c;
  long lVar2;
  long lVar3;
  Matrix<float,_2,_3> *mat;
  Matrix<float,_2,_3> *pMVar4;
  Matrix<float,_2,_3> retVal;
  Matrix<float,_2,_3> local_38;
  
  pMVar4 = &local_38;
  tcu::Matrix<float,_2,_3>::Matrix(&local_38);
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    fVar1 = a->m_data[lVar2];
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      *(float *)((long)pMVar4 + lVar3 * 8) = *(float *)(this + lVar3 * 4) * fVar1;
    }
    pMVar4 = (Matrix<float,_2,_3> *)((long)pMVar4 + 4);
  }
  tcu::transpose<float,2,3>(__return_storage_ptr__,(tcu *)&local_38,mat);
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}